

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::emitBlockSwitch(PrintC *this,BlockSwitch *bl)

{
  uint4 *__args;
  uint4 *puVar1;
  byte *pbVar2;
  iterator iVar3;
  FlowBlock *pFVar4;
  pointer puVar5;
  EmitXml *pEVar6;
  pointer pCVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  __args = &(this->super_PrintLanguage).mods;
  iVar3._M_current =
       (this->super_PrintLanguage).modstack.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->super_PrintLanguage).modstack.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_PrintLanguage).modstack,iVar3,__args);
  }
  else {
    *iVar3._M_current = (this->super_PrintLanguage).mods;
    (this->super_PrintLanguage).modstack.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  uVar8 = (this->super_PrintLanguage).mods & 0xfffffe7f;
  (this->super_PrintLanguage).mods = uVar8;
  iVar3._M_current =
       (this->super_PrintLanguage).modstack.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->super_PrintLanguage).modstack.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_PrintLanguage).modstack,iVar3,__args);
  }
  else {
    *iVar3._M_current = uVar8;
    (this->super_PrintLanguage).modstack.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  puVar1 = &(this->super_PrintLanguage).mods;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  pFVar4 = *(bl->super_BlockGraph).list.
            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*pFVar4->_vptr_FlowBlock[0xc])(pFVar4,this);
  puVar5 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar6 = (this->super_PrintLanguage).emit;
  (this->super_PrintLanguage).mods = puVar5[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar5 + -1;
  (*pEVar6->_vptr_EmitXml[8])();
  iVar3._M_current =
       (this->super_PrintLanguage).modstack.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->super_PrintLanguage).modstack.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_PrintLanguage).modstack,iVar3,__args);
  }
  else {
    *iVar3._M_current = (this->super_PrintLanguage).mods;
    (this->super_PrintLanguage).modstack.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar3._M_current + 1;
  }
  pbVar2 = (byte *)((long)&(this->super_PrintLanguage).mods + 1);
  *pbVar2 = *pbVar2 | 3;
  pFVar4 = *(bl->super_BlockGraph).list.
            super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  (*pFVar4->_vptr_FlowBlock[0xc])(pFVar4,this);
  puVar5 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar6 = (this->super_PrintLanguage).emit;
  (this->super_PrintLanguage).mods = puVar5[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar5 + -1;
  (*pEVar6->_vptr_EmitXml[0x21])(pEVar6,1,0);
  pEVar6 = (this->super_PrintLanguage).emit;
  (*pEVar6->_vptr_EmitXml[0x19])(pEVar6,"{",8);
  if (0 < (int)((ulong)((long)(bl->caseblocks).
                              super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(bl->caseblocks).
                             super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      emitSwitchCase(this,(int4)uVar11,bl);
      uVar8 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
      pCVar7 = (bl->caseblocks).
               super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&pCVar7->gototype + lVar10) == 0) {
        pFVar4 = *(FlowBlock **)((long)&pCVar7->block + lVar10);
        pEVar6 = (this->super_PrintLanguage).emit;
        uVar9 = (*pEVar6->_vptr_EmitXml[6])(pEVar6,pFVar4);
        (*pFVar4->_vptr_FlowBlock[0xc])(pFVar4,this);
        pCVar7 = (bl->caseblocks).
                 super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((&pCVar7->isexit)[lVar10] == true) &&
           (uVar11 != (int)((ulong)((long)(bl->caseblocks).
                                          super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7)
                           >> 4) * -0x55555555 - 1)) {
          (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
          emitGotoStatement(this,pFVar4,(FlowBlock *)0x0,2);
        }
        pEVar6 = (this->super_PrintLanguage).emit;
        (*pEVar6->_vptr_EmitXml[7])(pEVar6,(ulong)uVar9);
      }
      else {
        (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
        pCVar7 = (bl->caseblocks).
                 super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        emitGotoStatement(this,*(bl->super_BlockGraph).list.
                                super__Vector_base<FlowBlock_*,_std::allocator<FlowBlock_*>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                          *(FlowBlock **)((long)&pCVar7->block + lVar10),
                          *(uint4 *)((long)&pCVar7->gototype + lVar10));
      }
      pEVar6 = (this->super_PrintLanguage).emit;
      (*pEVar6->_vptr_EmitXml[0x23])(pEVar6,(ulong)uVar8);
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x30;
    } while ((long)uVar11 <
             (long)((int)((ulong)((long)(bl->caseblocks).
                                        super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(bl->caseblocks).
                                       super__Vector_base<BlockSwitch::CaseOrder,_std::allocator<BlockSwitch::CaseOrder>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                   -0x55555555));
  }
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar6 = (this->super_PrintLanguage).emit;
  (*pEVar6->_vptr_EmitXml[0x19])(pEVar6,"}",8);
  puVar5 = (this->super_PrintLanguage).modstack.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->super_PrintLanguage).mods = puVar5[-1];
  (this->super_PrintLanguage).modstack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar5 + -1;
  return;
}

Assistant:

void PrintC::emitBlockSwitch(const BlockSwitch *bl)

{
  FlowBlock *bl2;

  pushMod();
  unsetMod(no_branch|only_branch);
  pushMod();
  setMod(no_branch);
  bl->getSwitchBlock()->emit(this);
  popMod();
  emit->tagLine();
  pushMod();
  setMod(only_branch|comma_separate);
  bl->getSwitchBlock()->emit(this);
  popMod();
  emit->spaces(1);
  emit->print("{");

  for(int4 i=0;i<bl->getNumCaseBlocks();++i) {
    emitSwitchCase(i,bl);
    int4 id = emit->startIndent();
    if (bl->getGotoType(i)!=0) {
      emit->tagLine();
      emitGotoStatement(bl->getBlock(0),bl->getCaseBlock(i),bl->getGotoType(i));
    }
    else {
      bl2 = bl->getCaseBlock(i);
      int4 id2 = emit->beginBlock(bl2);
      bl2->emit(this);
      if (bl->isExit(i)&&(i!=bl->getNumCaseBlocks()-1)) {	// Blocks that formally exit the switch
	emit->tagLine();
	emitGotoStatement(bl2,(const FlowBlock *)0,FlowBlock::f_break_goto); // need an explicit break statement
      }
      emit->endBlock(id2);
    }
    emit->stopIndent(id);
  }
  emit->tagLine();
  emit->print("}");
  popMod();
}